

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
* __thiscall
EOPlus::Parser::ParseStateBlock_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  int iVar2;
  Parser_Error *pPVar3;
  pointer pPVar4;
  Token *t_00;
  Token *t_01;
  bool local_43b;
  Token local_410;
  string local_3c0;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_331;
  Token local_330;
  string local_2e0;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  anon_class_16_2_3f8e8a0c local_258;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_248;
  anon_class_24_3_65a2b430 local_228;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_210;
  undefined1 local_1f0 [8];
  State state;
  undefined1 local_f8 [6];
  bool has_desc;
  undefined1 local_d8 [8];
  string name;
  variant local_a8;
  undefined1 local_68 [8];
  Token t;
  Parser *this_local;
  
  t._72_8_ = this;
  util::variant::variant(&local_a8);
  Token::Token((Token *)local_68,Invalid,&local_a8);
  util::variant::~variant(&local_a8);
  bVar1 = GetToken(this,(Token *)local_68,1);
  if (!bVar1) {
    pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"Expected state-name after \'state\'.",&local_399);
    std::operator+(&local_378,&local_398," Got: ");
    pPVar4 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    Parser_Token_Server_Base::RejectToken(&local_410,pPVar4);
    token_got_string_abi_cxx11_(&local_3c0,(EOPlus *)&local_410,t_01);
    std::operator+(&local_358,&local_378,&local_3c0);
    pPVar4 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
    Parser_Error::Parser_Error(pPVar3,&local_358,iVar2);
    __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
  }
  util::variant::operator_cast_to_string((string *)local_d8,(variant *)&t);
  state.goal_rule._7_1_ = 0;
  bVar1 = GetToken(this,(Token *)local_68,0x40);
  local_43b = false;
  if (bVar1) {
    util::variant::operator_cast_to_string((string *)local_f8,(variant *)&t);
    state.goal_rule._7_1_ = 1;
    local_43b = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_f8,"{");
  }
  if ((state.goal_rule._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_f8);
  }
  if (local_43b != false) {
    state.goal_rule._6_1_ = 0;
    State::State((State *)local_1f0);
    local_228.has_desc = (bool *)((long)&state.goal_rule + 6);
    local_228.state = (State *)local_1f0;
    local_228.this = this;
    std::function<bool(std::__cxx11::string)>::function<EOPlus::Parser::ParseStateBlock()::__0,void>
              ((function<bool(std::__cxx11::string)> *)&local_210,&local_228);
    local_258.name = (string *)local_d8;
    local_258.this = this;
    std::function<void(std::__cxx11::string)>::function<EOPlus::Parser::ParseStateBlock()::__1,void>
              ((function<void(std::__cxx11::string)> *)&local_248,&local_258);
    ParseRuleActionBlock
              (this,(deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *)
                    ((long)&state.desc.field_2 + 8),
               (deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)
               &state.rules.super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,&local_210,&local_248);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function(&local_248);
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function(&local_210);
    std::__cxx11::string::operator=((string *)local_1f0,(string *)local_d8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_EOPlus::State_&,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               (State *)local_1f0);
    State::~State((State *)local_1f0);
    std::__cxx11::string::~string((string *)local_d8);
    Token::~Token((Token *)local_68);
    return __return_storage_ptr__;
  }
  local_331 = 1;
  pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"Expected opening brace \'{\' after state-name.",&local_2b9);
  std::operator+(&local_298,&local_2b8," Got: ");
  pPVar4 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  Parser_Token_Server_Base::RejectToken(&local_330,pPVar4);
  token_got_string_abi_cxx11_(&local_2e0,(EOPlus *)&local_330,t_00);
  std::operator+(&local_278,&local_298,&local_2e0);
  pPVar4 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
  Parser_Error::Parser_Error(pPVar3,&local_278,iVar2);
  local_331 = 0;
  __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
}

Assistant:

std::pair<std::string, State> Parser::ParseStateBlock()
	{
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			std::string name = t.data;

			if (this->GetToken(t, Token::Symbol) && std::string(t.data) == "{")
			{
				bool has_desc = false;
				State state;

				ParseRuleActionBlock(state.rules, state.actions, [&](std::string entry) -> bool
				{
					if (entry == "desc")
					{
						if (has_desc)
							PARSER_ERROR("State can only contain one description.");

						has_desc = true;
						state.desc = this->ParseDesc();
						return true;
					}
					else if (entry == "goal")
					{
						Rule rule = this->ParseRule();
						state.rules.push_back(rule);
						state.goal_rule = state.rules.size() - 1;
						return true;
					}
					else
					{
						return false;
					}
				},
				[&](std::string expected)
				{
					PARSER_ERROR_GOT("Expected state-block entry (" + expected + "/goal/desc) or closing brace '}' in state '" + name + "'.");
				});

				state.name = name;
				return std::pair<std::string, State>(name, state);
			}

			PARSER_ERROR_GOT("Expected opening brace '{' after state-name.");
		}

		PARSER_ERROR_GOT("Expected state-name after 'state'.");
	}